

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O1

void fp::API::setText(int x,int y,string *text)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"setText ",8);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(text->_M_dataplus)._M_p,text->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void fp::API::setText(int x, int y, const std::string &text) {
    std::cout << "setText " << x << " " << y << " " << text << std::endl;
}